

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# html.cpp
# Opt level: O2

Node * __thiscall crawler::Parser::parseElement(Node *__return_storage_ptr__,Parser *this)

{
  shared_ptr<crawler::Node> local_18;
  
  local_18.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_18.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  parseElement(__return_storage_ptr__,this,&local_18);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_18.super___shared_ptr<crawler::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

crawler::Node crawler::Parser::parseElement() { return parseElement(nullptr); }